

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O2

int ddReorderPreprocess(DdManager *table)

{
  long lVar1;
  int iVar2;
  
  cuddCacheFlush(table);
  cuddLocalCacheClearAll(table);
  iVar2 = 0;
  cuddGarbageCollect(table,0);
  table->isolated = 0;
  for (lVar1 = 0; lVar1 < table->size; lVar1 = lVar1 + 1) {
    if (table->vars[lVar1]->ref == 1) {
      iVar2 = iVar2 + 1;
      table->isolated = iVar2;
    }
  }
  iVar2 = cuddInitInteract(table);
  return (int)(iVar2 != 0);
}

Assistant:

static int
ddReorderPreprocess(
  DdManager * table)
{
    int i;
    int res;

    /* Clear the cache. */
    cuddCacheFlush(table);
    cuddLocalCacheClearAll(table);

    /* Eliminate dead nodes. Do not scan the cache again. */
    cuddGarbageCollect(table,0);

    /* Initialize number of isolated projection functions. */
    table->isolated = 0;
    for (i = 0; i < table->size; i++) {
        if (table->vars[i]->ref == 1) table->isolated++;
    }

    /* Initialize the interaction matrix. */
    res = cuddInitInteract(table);
    if (res == 0) return(0);

    return(1);

}